

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O3

bool __thiscall Rml::Element::IsPointWithinElement(Element *this,Vector2f point)

{
  Vector2f VVar1;
  undefined8 uVar2;
  Vector2f VVar3;
  pointer pPVar4;
  Box *this_00;
  long lVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  float local_68;
  float fStack_64;
  float local_58;
  float fStack_54;
  
  UpdateAbsoluteOffsetAndRenderBoxData(this);
  pPVar4 = (this->additional_boxes).
           super__Vector_base<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (((ulong)((long)(this->additional_boxes).
                     super__Vector_base<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4) >> 0x25 & 1) == 0) {
    VVar1 = this->absolute_offset;
    fStack_64 = point.y;
    lVar6 = -1;
    lVar5 = -0x40;
    do {
      if (lVar6 == -1) {
        fVar7 = 0.0;
        fVar8 = 0.0;
        this_00 = &this->main_box;
      }
      else {
        uVar2 = *(undefined8 *)((long)&(&pPVar4->box)[1].content + 8 + lVar5 + -8);
        fVar7 = (float)uVar2;
        fVar8 = (float)((ulong)uVar2 >> 0x20);
        this_00 = (Box *)((long)((pPVar4->box).area_edges + 0xffffffffffffffff) + 8U + lVar5);
      }
      local_58 = VVar1.x;
      fStack_54 = VVar1.y;
      VVar3 = Box::GetSize(this_00,Border);
      local_68 = point.x;
      if ((((local_58 + fVar7 <= local_68) && (local_68 <= local_58 + fVar7 + VVar3.x)) &&
          (fVar8 + fStack_54 <= fStack_64)) && (fStack_64 <= fVar8 + fStack_54 + VVar3.y)) {
        return true;
      }
      pPVar4 = (this->additional_boxes).
               super__Vector_base<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x40;
    } while (lVar6 < (int)((ulong)((long)(this->additional_boxes).
                                         super__Vector_base<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4)
                          >> 6));
  }
  return false;
}

Assistant:

bool Element::IsPointWithinElement(const Vector2f point)
{
	const Vector2f position = GetAbsoluteOffset(BoxArea::Border);

	for (int i = 0; i < GetNumBoxes(); ++i)
	{
		Vector2f box_offset;
		const Box& box = GetBox(i, box_offset);

		const Vector2f box_position = position + box_offset;
		const Vector2f box_dimensions = box.GetSize(BoxArea::Border);
		if (point.x >= box_position.x && point.x <= (box_position.x + box_dimensions.x) && point.y >= box_position.y &&
			point.y <= (box_position.y + box_dimensions.y))
		{
			return true;
		}
	}

	return false;
}